

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t icu_63::firstIslamicStartYearFromGrego(int32_t year)

{
  int local_18;
  int shift;
  int offset;
  int cycle;
  int32_t year_local;
  
  if (year < 0x7b9) {
    local_18 = ((year + -0x7b8) / 0x41 + -1) * 2 + (uint)(-(year + -0x7b8) % 0x41 < 0x21);
  }
  else {
    local_18 = ((year + -0x7b9) / 0x41) * 2 + (uint)(0x1f < (year + -0x7b9) % 0x41);
  }
  return year + -0x243 + local_18;
}

Assistant:

static int32_t firstIslamicStartYearFromGrego(int32_t year) {
    // ad hoc conversion, improve under #10752
    // rough est for now, ok for grego 1846-2138,
    // otherwise occasionally wrong (for 3% of years)
    int cycle, offset, shift = 0;
    if (year >= 1977) {
        cycle = (year - 1977) / 65;
        offset = (year - 1977) % 65;
        shift = 2*cycle + ((offset >= 32)? 1: 0);
    } else {
        cycle = (year - 1976) / 65 - 1;
        offset = -(year - 1976) % 65;
        shift = 2*cycle + ((offset <= 32)? 1: 0);
    }
    return year - 579 + shift;
}